

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMem.c
# Opt level: O1

Fraig_MemFixed_t * Fraig_MemFixedStart(int nEntrySize)

{
  uint uVar1;
  Fraig_MemFixed_t *pFVar2;
  char **ppcVar3;
  
  pFVar2 = (Fraig_MemFixed_t *)malloc(0x38);
  pFVar2->nEntrySize = 0;
  pFVar2->nEntriesAlloc = 0;
  pFVar2->nEntriesUsed = 0;
  pFVar2->nEntriesMax = 0;
  pFVar2->pEntriesFree = (char *)0x0;
  pFVar2->nChunkSize = 0;
  pFVar2->nChunksAlloc = 0;
  *(undefined8 *)&pFVar2->nChunks = 0;
  pFVar2->pChunks = (char **)0x0;
  pFVar2->nMemoryUsed = 0;
  pFVar2->nMemoryAlloc = 0;
  pFVar2->nEntrySize = nEntrySize;
  pFVar2->nEntriesAlloc = 0;
  pFVar2->nEntriesUsed = 0;
  pFVar2->pEntriesFree = (char *)0x0;
  uVar1 = 0x400;
  if (0x3f < nEntrySize) {
    uVar1 = 0x10000 / (uint)nEntrySize;
  }
  pFVar2->nChunkSize = uVar1;
  if (uVar1 < 8) {
    pFVar2->nChunkSize = 8;
  }
  pFVar2->nChunksAlloc = 0x40;
  pFVar2->nChunks = 0;
  ppcVar3 = (char **)malloc(0x200);
  pFVar2->pChunks = ppcVar3;
  pFVar2->nMemoryUsed = 0;
  pFVar2->nMemoryAlloc = 0;
  return pFVar2;
}

Assistant:

Fraig_MemFixed_t * Fraig_MemFixedStart( int nEntrySize )
{
    Fraig_MemFixed_t * p;

    p = ABC_ALLOC( Fraig_MemFixed_t, 1 );
    memset( p, 0, sizeof(Fraig_MemFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}